

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O3

uint8_t * __thiscall flatbuffers::vector_downward::make_space(vector_downward *this,size_t len)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint8_t *puVar3;
  ulong __n;
  ulong uVar4;
  uint8_t *puVar5;
  
  puVar1 = this->buf_;
  puVar5 = this->cur_;
  puVar3 = puVar1;
  if (puVar5 + -len < puVar1) {
    uVar2 = this->reserved_;
    uVar4 = uVar2 >> 1 & 0xfffffffffffffff8;
    if (uVar4 <= len) {
      uVar4 = len;
    }
    __n = (ulong)(uint)(((int)puVar1 - (int)puVar5) + (int)uVar2);
    uVar4 = uVar4 + uVar2;
    this->reserved_ = uVar4;
    puVar3 = (uint8_t *)operator_new__(uVar4);
    memcpy(puVar3 + (uVar4 - __n),puVar5,__n);
    this->cur_ = puVar3 + (uVar4 - __n);
    operator_delete__(puVar1);
    this->buf_ = puVar3;
    puVar5 = this->cur_;
  }
  puVar5 = puVar5 + -len;
  this->cur_ = puVar5;
  if ((uint)((int)puVar3 + ((int)this->reserved_ - (int)puVar5)) < 0x7fffffff) {
    return puVar5;
  }
  __assert_fail("size() < (1UL << (sizeof(soffset_t) * 8 - 1)) - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                ,0xe1,"uint8_t *flatbuffers::vector_downward::make_space(size_t)");
}

Assistant:

uint8_t *make_space(size_t len) {
    if (buf_ > cur_ - len) {
      auto old_size = size();
      reserved_ += std::max(len, growth_policy(reserved_));
      auto new_buf = new uint8_t[reserved_];
      auto new_cur = new_buf + reserved_ - old_size;
      memcpy(new_cur, cur_, old_size);
      cur_ = new_cur;
      delete[] buf_;
      buf_ = new_buf;
    }
    cur_ -= len;
    // Beyond this, signed offsets may not have enough range:
    // (FlatBuffers > 2GB not supported).
    assert(size() < (1UL << (sizeof(soffset_t) * 8 - 1)) - 1);
    return cur_;
  }